

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64NestedFlatBuffer(void)

{
  long lVar1;
  long lVar2;
  bool expval;
  uint *puVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> off;
  ulong uVar7;
  uoffset_t uVar8;
  int *piVar9;
  Offset<flatbuffers::String> OVar10;
  uchar *v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nested_data;
  FlatBufferBuilder64 fbb;
  uchar *local_108;
  long local_100;
  long local_f8;
  FlatBufferBuilderImpl<true> local_f0;
  VerifierTemplate<false> local_70;
  
  local_f0.buf_.allocator_ = (Allocator *)0x0;
  local_f0.buf_.own_allocator_ = false;
  local_f0.buf_.initial_size_ = 0x400;
  local_f0.buf_.max_size_ = 0x7fffffffffffffff;
  local_f0.buf_.buffer_minalign_ = 8;
  local_f0.length_of_64_bit_region_ = 0;
  local_f0.nested = false;
  local_f0.finished = false;
  local_f0.buf_.reserved_ = 0;
  local_f0.buf_.size_ = 0;
  local_f0.buf_.buf_ = (uint8_t *)0x0;
  local_f0.buf_.cur_._0_6_ = 0;
  local_f0.buf_.cur_._6_2_ = 0;
  local_f0.buf_.scratch_._0_6_ = 0;
  local_f0.buf_.scratch_._6_2_ = 0;
  local_f0.num_field_loc = 0;
  local_f0.max_voffset_ = 0;
  local_f0.minalign_ = 1;
  local_f0.force_defaults_ = false;
  local_f0.dedup_vtables_ = true;
  local_f0.string_pool = (StringOffsetMap *)0x0;
  FlatBufferBuilderImpl<true>::CreateStringImpl(&local_f0,"nested: some near string",0x18);
  OVar10.o = (int)local_f0.buf_.size_ - (int)local_f0.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::NotNested(&local_f0);
  local_f0.nested = true;
  uVar8 = (int)local_f0.buf_.size_ - (int)local_f0.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f0,0x16,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>
            (&local_f0,0x12,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f0,0xe,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f0,10,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>
            (&local_f0,0x14,
             (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>
            (&local_f0,0x10,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_f0,0xc,OVar10);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>
            (&local_f0,8,(Offset64<flatbuffers::String>)0x0);
  FlatBufferBuilderImpl<true>::AddElement<int>(&local_f0,6,0,0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            (&local_f0,4,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0);
  uVar8 = FlatBufferBuilderImpl<true>::EndTable(&local_f0,uVar8);
  FlatBufferBuilderImpl<true>::Finish(&local_f0,uVar8,(char *)0x0,false);
  puVar3 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f0);
  uVar7 = (ulong)*puVar3;
  uVar4 = (ulong)*(ushort *)((long)puVar3 + (uVar7 - (long)*(int *)((long)puVar3 + uVar7)) + 0xc);
  TestEqStr((char *)((long)puVar3 +
                    (ulong)*(uint *)((long)puVar3 + uVar4 + uVar7) + uVar4 + uVar7 + 4),
            "nested: some near string",
            "\'root_table->near_string()->c_str()\' != \'\"nested: some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x80,"");
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f0);
  puVar6 = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_108,puVar5,
             puVar6 + local_f0.buf_.size_,(allocator_type *)&local_70);
  local_f0.num_field_loc = 0;
  local_f0.max_voffset_ = 0;
  if (local_f0.buf_.buf_ == (uint8_t *)0x0) {
    local_f0.buf_.reserved_ = 0;
    puVar5 = (uint8_t *)0x0;
  }
  else {
    puVar5 = local_f0.buf_.buf_ + local_f0.buf_.reserved_;
  }
  local_f0.buf_.cur_._0_6_ = SUB86(puVar5,0);
  local_f0.buf_.cur_._6_2_ = (undefined2)((ulong)puVar5 >> 0x30);
  local_f0.buf_.size_ = 0;
  local_f0.buf_.scratch_._0_6_ = SUB86(local_f0.buf_.buf_,0);
  local_f0.buf_.scratch_._6_2_ = (undefined2)((ulong)local_f0.buf_.buf_ >> 0x30);
  local_f0.nested = false;
  local_f0.finished = false;
  local_f0.minalign_ = 1;
  local_f0.length_of_64_bit_region_ = 0;
  if (local_f0.string_pool != (StringOffsetMap *)0x0) {
    std::
    _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<true>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::clear((_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<true>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
             *)local_f0.string_pool);
  }
  v = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
       ::t;
  if (local_100 - (long)local_108 != 0) {
    v = local_108;
  }
  off = FlatBufferBuilderImpl<true>::
        CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                  (&local_f0,v,local_100 - (long)local_108);
  FlatBufferBuilderImpl<true>::CreateStringImpl(&local_f0,"some near string",0x10);
  OVar10.o = (int)local_f0.buf_.size_ - (int)local_f0.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::NotNested(&local_f0);
  local_f0.nested = true;
  uVar8 = (int)local_f0.buf_.size_ - (int)local_f0.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f0,0x16,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>
            (&local_f0,0x12,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f0,0xe,off);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f0,10,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>
            (&local_f0,0x14,
             (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>
            (&local_f0,0x10,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_f0,0xc,OVar10);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>
            (&local_f0,8,(Offset64<flatbuffers::String>)0x0);
  FlatBufferBuilderImpl<true>::AddElement<int>(&local_f0,6,0,0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            (&local_f0,4,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0);
  uVar8 = FlatBufferBuilderImpl<true>::EndTable(&local_f0,uVar8);
  FlatBufferBuilderImpl<true>::Finish(&local_f0,uVar8,(char *)0x0,false);
  local_70.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f0);
  local_70.size_ = local_f0.buf_.size_;
  local_70.opts_.max_depth = 0x40;
  local_70.opts_.max_tables = 1000000;
  local_70.opts_.check_alignment = true;
  local_70.opts_.check_nested_flatbuffers = true;
  local_70.opts_.max_size = 0x7fffffffffffffff;
  local_70.opts_.assert = true;
  local_70.upper_bound_ = 0;
  local_70.depth_ = 0;
  local_70.num_tables_ = 0;
  local_70.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (local_f0.buf_.size_ < 0x7fffffffffffffff) {
    expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_70,(char *)0x0,0);
    TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xa0,"");
    puVar3 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f0);
    if (puVar3 == (uint *)0x0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)((ulong)*puVar3 + (long)puVar3);
    }
    uVar4 = (ulong)*(ushort *)((long)piVar9 + (0xc - (long)*piVar9));
    TestEqStr((char *)((long)piVar9 + *(uint *)((long)piVar9 + uVar4) + uVar4 + 4),
              "some near string",
              "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0xa7,"");
    uVar4 = (ulong)*(ushort *)((long)piVar9 + (0xe - (long)*piVar9));
    TestEq<unsigned_long,unsigned_long>
              (*(unsigned_long *)((long)piVar9 + *(long *)((long)piVar9 + uVar4) + uVar4),
               local_100 - (long)local_108,
               "\'root_table->nested_root()->size()\' != \'nested_data.size()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
               ,0xaa,"");
    uVar4 = (ulong)*(ushort *)((long)piVar9 + (0xe - (long)*piVar9));
    lVar1 = *(long *)((long)piVar9 + uVar4) + uVar4;
    uVar4 = (ulong)*(uint *)((long)piVar9 + *(long *)((long)piVar9 + uVar4) + 8 + uVar4);
    lVar2 = uVar4 + lVar1 + 8;
    uVar4 = (ulong)*(ushort *)
                    ((long)piVar9 + (lVar2 - *(int *)((long)piVar9 + uVar4 + 8 + lVar1)) + 0xc);
    TestEqStr((char *)((long)piVar9 +
                      (ulong)*(uint *)((long)piVar9 + uVar4 + lVar2) + uVar4 + lVar2 + 4),
              "nested: some near string",
              "\'root_table->nested_root_nested_root()->near_string()->c_str()\' != \'\"nested: some near string\"\'"
              ,
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0xae,"");
    if (local_108 != (uchar *)0x0) {
      operator_delete(local_108,local_f8 - (long)local_108);
    }
    FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_f0);
    return;
  }
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

void Offset64NestedFlatBuffer() {
  FlatBufferBuilder64 fbb;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      fbb.CreateString("nested: some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(fbb, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  fbb.Finish(root_table_offset);

  // Ensure the buffer is valid.
  const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());
  TEST_EQ_STR(root_table->near_string()->c_str(), "nested: some near string");

  // Copy the data out of the builder.
  std::vector<uint8_t> nested_data{ fbb.GetBufferPointer(),
                                    fbb.GetBufferPointer() + fbb.GetSize() };

  {
    // Clear so we can reuse the builder.
    fbb.Clear();

    const Offset64<Vector64<uint8_t>> nested_flatbuffer_offset =
        fbb.CreateVector64<Vector64>(nested_data);

    // Now that we are done with the 64-bit fields, we can create and add the
    // normal fields.
    const Offset<String> near_string_offset =
        fbb.CreateString("some near string");

    // Finish by building the root table by passing in all the offsets.
    const Offset<RootTable> root_table_offset = CreateRootTable(
        fbb, 0, 0, 0, 0, near_string_offset, nested_flatbuffer_offset);

    // Finish the buffer.
    fbb.Finish(root_table_offset);

    Verifier::Options options;
    // Allow the verifier to verify 64-bit buffers.
    options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
    options.assert = true;

    Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize(), options);

    TEST_EQ(VerifyRootTableBuffer(verifier), true);
  }

  {
    const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());

    // Test that the parent buffer field is ok.
    TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");

    // Expect nested buffer to be properly sized.
    TEST_EQ(root_table->nested_root()->size(), nested_data.size());

    // Expect the direct accessors to the nested buffer work.
    TEST_EQ_STR(root_table->nested_root_nested_root()->near_string()->c_str(),
                "nested: some near string");
  }
}